

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lode_png_test_bitreader(uchar *data,size_t size,size_t numsteps,size_t *steps,uint *result)

{
  ulong nbits;
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  LodePNGBitReader local_58;
  
  local_58.bitsize = size * 8;
  if (local_58.bitsize < 0xffffffffffffffc0 && size >> 0x3d == 0) {
    local_58.bp = 0;
    local_58.buffer = 0;
    uVar4 = 1;
    if (numsteps != 0) {
      sVar5 = 0;
      local_58.data = data;
      local_58.size = size;
      do {
        nbits = steps[sVar5];
        bVar1 = (byte)local_58.bp;
        if (nbits < 0x1a) {
          if (nbits < 0x12) {
            if (nbits < 10) {
              uVar2 = ensureBits9(&local_58,nbits);
            }
            else {
              uVar2 = ensureBits17(&local_58,nbits);
            }
            goto LAB_0011ad2a;
          }
          uVar3 = local_58.bp >> 3;
          if (local_58.size <= uVar3 + 3) {
            local_58.buffer = 0;
            if (uVar3 < local_58.size) {
              local_58.buffer = (uint)local_58.data[uVar3];
            }
            if (uVar3 + 1 < local_58.size) {
              local_58.buffer = local_58.buffer | (uint)local_58.data[uVar3 + 1] << 8;
            }
            if (uVar3 + 2 < local_58.size) {
              local_58.buffer = local_58.buffer | (uint)local_58.data[uVar3 + 2] << 0x10;
            }
            local_58.buffer = local_58.buffer >> (bVar1 & 7);
            goto LAB_0011ad16;
          }
          local_58.buffer = *(uint *)(local_58.data + uVar3) >> (bVar1 & 7);
        }
        else {
          uVar3 = local_58.bp >> 3;
          if (uVar3 + 4 < local_58.size) {
            local_58.buffer =
                 ((uint)local_58.data[uVar3 + 4] << 0x18) << (8 - (bVar1 & 7) & 0x1f) |
                 *(uint *)(local_58.data + uVar3) >> (bVar1 & 7);
          }
          else {
            local_58.buffer = 0;
            if (uVar3 < local_58.size) {
              local_58.buffer = (uint)local_58.data[uVar3];
            }
            if (uVar3 + 1 < local_58.size) {
              local_58.buffer = local_58.buffer | (uint)local_58.data[uVar3 + 1] << 8;
            }
            if (uVar3 + 2 < local_58.size) {
              local_58.buffer = local_58.buffer | (uint)local_58.data[uVar3 + 2] << 0x10;
            }
            if (uVar3 + 3 < local_58.size) {
              local_58.buffer = local_58.buffer | (uint)local_58.data[uVar3 + 3] << 0x18;
            }
            local_58.buffer = local_58.buffer >> (bVar1 & 7);
LAB_0011ad16:
            uVar2 = (uint)(local_58.bp + nbits <= local_58.bitsize);
LAB_0011ad2a:
            if (uVar2 == 0) goto LAB_0011ad65;
          }
        }
        uVar2 = ~(-1 << ((byte)nbits & 0x1f)) & local_58.buffer;
        local_58.buffer = local_58.buffer >> ((byte)nbits & 0x1f);
        local_58.bp = local_58.bp + nbits;
        result[sVar5] = uVar2;
        sVar5 = sVar5 + 1;
      } while (numsteps != sVar5);
    }
  }
  else {
LAB_0011ad65:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

unsigned lode_png_test_bitreader(const unsigned char* data, size_t size,
                                 size_t numsteps, const size_t* steps, unsigned* result) {
  size_t i;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, data, size);
  if(error) return 0;
  for(i = 0; i < numsteps; i++) {
    size_t step = steps[i];
    unsigned ok;
    if(step > 25) ok = ensureBits32(&reader, step);
    else if(step > 17) ok = ensureBits25(&reader, step);
    else if(step > 9) ok = ensureBits17(&reader, step);
    else ok = ensureBits9(&reader, step);
    if(!ok) return 0;
    result[i] = readBits(&reader, step);
  }
  return 1;
}